

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O2

vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>
* __thiscall
burst::detail::
apply_impl<burst::make_range_vector_t_const&,std::tuple<std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&>&,0ul,1ul,2ul>
          (vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,detail *this,undefined8 *f)

{
  make_range_vector_t::operator()
            (__return_storage_ptr__,(make_range_vector_t *)this,
             (vector<char,_std::allocator<char>_> *)f[2],(vector<char,_std::allocator<char>_> *)f[1]
             ,(vector<char,_std::allocator<char>_> *)*f);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto)
            apply_impl
            (
                NaryFunction && f,
                Tuple && t,
                std::index_sequence<Indices...>
            )
        {
            return invoke(std::forward<NaryFunction>(f), std::get<Indices>(std::forward<Tuple>(t))...);
        }